

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O1

void * Curl_ssl_scache_get_obj(Curl_cfilter *cf,Curl_easy *data,char *ssl_peer_key)

{
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  Curl_ssl_scache *scache;
  ssl_primary_config *conn_config;
  char *pcVar3;
  void *pvVar4;
  Curl_ssl_scache_peer *peer;
  Curl_ssl_scache_peer *local_28;
  
  scache = cf_ssl_scache_get(data);
  conn_config = Curl_ssl_cf_get_primary_config(cf);
  local_28 = (Curl_ssl_scache_peer *)0x0;
  if ((scache == (Curl_ssl_scache *)0x0) ||
     (CVar2 = cf_ssl_find_peer_by_key(data,scache,ssl_peer_key,conn_config,&local_28),
     CVar2 != CURLE_OK)) {
    return (void *)0x0;
  }
  if (local_28 == (Curl_ssl_scache_peer *)0x0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = local_28->sobj;
  }
  if (data == (Curl_easy *)0x0) {
    return pvVar4;
  }
  if (((data->set).field_0x89f & 0x40) == 0) {
    return pvVar4;
  }
  pcVar1 = (data->state).feat;
  if ((pcVar1 != (curl_trc_feat *)0x0) && (pcVar1->log_level < 1)) {
    return pvVar4;
  }
  if (Curl_trc_feat_ssls.log_level < 1) {
    return pvVar4;
  }
  pcVar3 = "Found";
  if (pvVar4 == (void *)0x0) {
    pcVar3 = "No";
  }
  Curl_trc_ssls(data,"%s cached session for \'%s\'",pcVar3,ssl_peer_key);
  return pvVar4;
}

Assistant:

void *Curl_ssl_scache_get_obj(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              const char *ssl_peer_key)
{
  struct Curl_ssl_scache *scache = cf_ssl_scache_get(data);
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct Curl_ssl_scache_peer *peer = NULL;
  CURLcode result;
  void *sobj;

  if(!scache)
    return NULL;

  result = cf_ssl_find_peer_by_key(data, scache, ssl_peer_key, conn_config,
                                   &peer);
  if(result)
    return NULL;

  sobj = peer ? peer->sobj : NULL;

  CURL_TRC_SSLS(data, "%s cached session for '%s'",
                sobj ? "Found" : "No", ssl_peer_key);
  return sobj;
}